

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O3

void __thiscall depspawn::internal::TaskPool::Task::run(Task *this)

{
  Workitem *pWVar1;
  undefined8 uVar2;
  TaskPool *pTVar3;
  long in_FS_OFFSET;
  
  pWVar1 = this->ctx_;
  if (pWVar1 == (Workitem *)0x0) {
    if ((this->func_).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->func_)._M_invoker)((_Any_data *)this);
      return;
    }
  }
  else {
    pWVar1->status = Running;
    uVar2 = *(undefined8 *)(in_FS_OFFSET + -8);
    *(Workitem **)(in_FS_OFFSET + -8) = pWVar1;
    if ((this->func_).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->func_)._M_invoker)((_Any_data *)this);
      *(undefined8 *)(in_FS_OFFSET + -8) = uVar2;
      (*this->ctx_->_vptr_Workitem[2])();
      return;
    }
  }
  std::__throw_bad_function_call();
  LOCK();
  (anonymous_namespace)::worklist = 0;
  UNLOCK();
  LOCK();
  (anonymous_namespace)::eraser_assigned = 0;
  UNLOCK();
  LOCK();
  (anonymous_namespace)::ObserversAtWork = 0;
  UNLOCK();
  *(undefined8 *)(in_FS_OFFSET + -8) = 0;
  pTVar3 = TP;
  if (TP == (TaskPool *)0x0) {
    pTVar3 = (TaskPool *)operator_new(0x230);
    TaskPool(pTVar3,Nthreads + -1,4,true);
    TP = pTVar3;
    return;
  }
  if (TP->finish_ != true) {
    return;
  }
  LOCK();
  (TP->busy_threads_).super___atomic_base<int>._M_i = (TP->thread_pool_).nthreads_in_use_;
  UNLOCK();
  pTVar3->finish_ = false;
  ThreadPool::launch_theads(&pTVar3->thread_pool_);
  return;
}

Assistant:

void TaskPool::Task::run()
  {
    if (ctx_) {
      ctx_->status = Workitem::Status_t::Running;

      Workitem *& ref_father_lcl = enum_thr_spec_father;
      Workitem * const prev_enum_thr_spec_father = ref_father_lcl;
      ref_father_lcl = ctx_;

      func_();

      ref_father_lcl = prev_enum_thr_spec_father;

      ctx_->finish_execution();
    } else {
      func_();
    }
  }